

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O0

bool __thiscall duckdb::StringValueResult::AddRowInternal(StringValueResult *this)

{
  ulong uVar1;
  bool bVar2;
  unsigned_long *puVar3;
  size_type sVar4;
  type pbVar5;
  reference ppvVar6;
  undefined8 *puVar7;
  idx_t iVar8;
  mapped_type *pmVar9;
  CSVError *csv_error_00;
  void *__src;
  long in_RDI;
  CSVError csv_error_1;
  CSVError csv_error;
  LinesPerBoundary lines_per_batch;
  string borked_line;
  bool first_nl;
  string *in_stack_00000230;
  idx_t in_stack_00000238;
  bool empty;
  CSVReaderOptions *in_stack_00000240;
  optional_idx in_stack_00000248;
  LinesPerBoundary in_stack_00000250;
  idx_t col_idx;
  idx_t in_stack_00000270;
  idx_t current_line_size;
  LinePosition current_line_start;
  StringValueResult *in_stack_00000870;
  LineError *in_stack_00000878;
  CSVErrorHandler *in_stack_fffffffffffffd58;
  CSVReaderOptions *in_stack_fffffffffffffd60;
  StringValueResult *in_stack_fffffffffffffd70;
  idx_t in_stack_fffffffffffffd78;
  CSVErrorHandler *in_stack_fffffffffffffd80;
  undefined8 in_stack_fffffffffffffd90;
  undefined1 uVar10;
  CSVError *in_stack_fffffffffffffd98;
  CSVErrorHandler *in_stack_fffffffffffffda0;
  CSVErrorHandler *this_00;
  idx_t in_stack_fffffffffffffdd8;
  CSVReaderOptions *in_stack_fffffffffffffde0;
  idx_t *in_stack_fffffffffffffde8;
  idx_t *in_stack_fffffffffffffdf0;
  CSVErrorType *in_stack_fffffffffffffdf8;
  LineError *in_stack_fffffffffffffe00;
  StringValueResult *in_stack_fffffffffffffe20;
  undefined7 local_170;
  undefined1 in_stack_fffffffffffffe97;
  unordered_map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
  *in_stack_fffffffffffffe98;
  bool *in_stack_fffffffffffffea0;
  FullLinePosition *in_stack_fffffffffffffea8;
  LinesPerBoundary local_b0;
  string local_a0 [39];
  byte local_79;
  undefined8 local_78;
  undefined8 local_70;
  byte local_61;
  undefined8 local_60;
  long local_58;
  undefined1 local_49;
  ulong local_48;
  undefined8 local_40;
  undefined1 local_31;
  idx_t local_30;
  LinePosition local_28;
  bool local_1;
  
  LinePosition::LinePosition
            (&local_28,**(idx_t **)(in_RDI + 0x110),*(idx_t *)(*(long *)(in_RDI + 0x110) + 8),
             *(idx_t *)(in_RDI + 0x78));
  local_30 = LinePosition::operator-(&local_28,(LinePosition *)(in_RDI + 0x130));
  if ((*(byte *)(in_RDI + 0x180) & 1) != 0) {
    CSVErrorHandler::NewMaxLineSize(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  }
  iVar8 = local_30;
  *(undefined8 *)(in_RDI + 0x118) = *(undefined8 *)(in_RDI + 0x130);
  *(undefined8 *)(in_RDI + 0x120) = *(undefined8 *)(in_RDI + 0x138);
  *(undefined8 *)(in_RDI + 0x128) = *(undefined8 *)(in_RDI + 0x140);
  *(idx_t *)(in_RDI + 0x130) = local_28.buffer_pos;
  *(idx_t *)(in_RDI + 0x138) = local_28.buffer_size;
  *(idx_t *)(in_RDI + 0x140) = local_28.buffer_idx;
  puVar3 = CSVOption<unsigned_long>::GetValue
                     ((CSVOption<unsigned_long> *)
                      (*(long *)(*(long *)(in_RDI + 0x30) + 0x40) + 0x1e8));
  if (*puVar3 < iVar8) {
    local_31 = 6;
    local_40 = 1;
    LineError::Insert(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                      in_stack_fffffffffffffde8,(LinePosition *)in_stack_fffffffffffffde0,
                      in_stack_fffffffffffffdd8);
  }
  uVar10 = (undefined1)((ulong)in_stack_fffffffffffffd90 >> 0x38);
  if ((*(byte *)(*(long *)(*(long *)(in_RDI + 0x30) + 0x40) + 0x2c0) & 1) == 0) {
    for (local_48 = *(ulong *)(in_RDI + 0xf8);
        uVar10 = (undefined1)((ulong)in_stack_fffffffffffffd90 >> 0x38),
        local_48 < *(uint *)(in_RDI + 0x88); local_48 = local_48 + 1) {
      local_49 = 2;
      local_58 = local_48 - 1;
      LineError::Insert(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                        in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                        (LinePosition *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    }
  }
  bVar2 = LineError::HandleErrors(in_stack_00000878,in_stack_00000870);
  if (bVar2) {
    local_60 = *(undefined8 *)(in_RDI + 0xf0);
    pmVar9 = ::std::
             unordered_map<unsigned_long,_duckdb::FullLinePosition,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>_>
             ::operator[]((unordered_map<unsigned_long,_duckdb::FullLinePosition,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>_>
                           *)in_stack_fffffffffffffd60,(key_type *)in_stack_fffffffffffffd58);
    memcpy(pmVar9,(void *)(in_RDI + 0x118),0x30);
    *(long *)(in_RDI + 0xf0) = *(long *)(in_RDI + 0xf0) + 1;
    if (*(ulong *)(in_RDI + 0xf0) < *(ulong *)(in_RDI + 0x28)) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    NullPaddingQuotedNewlineCheck(in_stack_fffffffffffffe20);
    *(undefined1 *)(in_RDI + 0x182) = 0;
    if (*(ulong *)(in_RDI + 0xf8) < (ulong)*(uint *)(in_RDI + 0x88)) {
      if ((*(byte *)(in_RDI + 0x8c) & 1) == 0) {
        bVar2 = CSVReaderOptions::IgnoreErrors(in_stack_fffffffffffffd60);
        if (!bVar2) {
          local_79 = 0;
          PrintErrorLine(in_stack_fffffffffffffd70);
          FullLinePosition::
          ReconstructCurrentLine<std::unordered_map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
                    (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                     (bool)in_stack_fffffffffffffe97);
          iVar8 = CSVIterator::GetBoundaryIdx(*(CSVIterator **)(in_RDI + 0x110));
          LinesPerBoundary::LinesPerBoundary(&local_b0,iVar8,**(idx_t **)(in_RDI + 0x1b8));
          bVar2 = LinePosition::operator==
                            ((LinePosition *)(in_RDI + 0x118),(LinePosition *)(in_RDI + 0x10));
          if (bVar2) {
            uVar10 = (undefined1)((ulong)*(undefined8 *)(*(long *)(in_RDI + 0x30) + 0x40) >> 0x38);
            csv_error_00 = (CSVError *)(*(long *)(in_RDI + 0xf8) - 1);
            in_stack_fffffffffffffd58 =
                 (CSVErrorHandler *)
                 LinePosition::GetGlobalPosition
                           ((LinePosition *)(in_RDI + 0x118),*(idx_t *)(in_RDI + 0x218),
                            (bool)(local_79 & 1));
            LinePosition::GetGlobalPosition
                      ((LinePosition *)(in_RDI + 0x10),*(idx_t *)(in_RDI + 0x218),
                       (bool)(local_79 & 1));
            optional_idx::optional_idx
                      ((optional_idx *)in_stack_fffffffffffffd58,(idx_t)csv_error_00);
            in_stack_fffffffffffffd60 =
                 (CSVReaderOptions *)CONCAT17(in_stack_fffffffffffffe97,local_170);
            this_00 = in_stack_fffffffffffffd58;
            CSVError::IncorrectColumnAmountError
                      (in_stack_00000240,in_stack_00000238,in_stack_00000250,in_stack_00000230,
                       in_stack_00000270,in_stack_00000248,(string *)current_line_start.buffer_pos);
            CSVErrorHandler::Error(this_00,csv_error_00,(bool)uVar10);
            CSVError::~CSVError((CSVError *)in_stack_fffffffffffffd60);
          }
          else {
            in_stack_fffffffffffffd58 =
                 (CSVErrorHandler *)
                 LinePosition::GetGlobalPosition
                           ((LinePosition *)(in_RDI + 0x118),*(idx_t *)(in_RDI + 0x218),
                            (bool)(local_79 & 1));
            LinePosition::GetGlobalPosition
                      ((LinePosition *)(in_RDI + 0x10),*(idx_t *)(in_RDI + 0x218),false);
            in_stack_fffffffffffffd60 = in_stack_fffffffffffffde0;
            optional_idx::optional_idx
                      ((optional_idx *)in_stack_fffffffffffffda0,(idx_t)in_stack_fffffffffffffd98);
            CSVError::IncorrectColumnAmountError
                      (in_stack_00000240,in_stack_00000238,in_stack_00000250,in_stack_00000230,
                       in_stack_00000270,in_stack_00000248,(string *)current_line_start.buffer_pos);
            CSVErrorHandler::Error(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,(bool)uVar10)
            ;
            CSVError::~CSVError((CSVError *)in_stack_fffffffffffffd60);
          }
          ::std::__cxx11::string::~string(local_a0);
        }
        RemoveLastLine((StringValueResult *)in_stack_fffffffffffffd60);
      }
      else {
        while (*(ulong *)(in_RDI + 0xf8) < (ulong)*(uint *)(in_RDI + 0x88)) {
          local_61 = 0;
          uVar1 = *(ulong *)(in_RDI + 0xf8);
          sVar4 = ::std::vector<bool,_std::allocator<bool>_>::size
                            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffda0);
          if (uVar1 < sVar4) {
            local_61 = vector<bool,_true>::operator[]
                                 ((vector<bool,_true> *)in_stack_fffffffffffffd60,
                                  (size_type)in_stack_fffffffffffffd58);
          }
          if (((*(byte *)(in_RDI + 0x1c8) & 1) == 0) ||
             (pbVar5 = unique_ptr<bool[],_std::default_delete<bool>,_false>::operator[]
                                 ((unique_ptr<bool[],_std::default_delete<bool>,_false> *)
                                  in_stack_fffffffffffffd60,(size_t)in_stack_fffffffffffffd58),
             (*pbVar5 & 1U) != 0)) {
            if ((local_61 & 1) == 0) {
              vector<duckdb::ValidityMask_*,_false>::operator[]
                        ((vector<duckdb::ValidityMask_*,_false> *)in_stack_fffffffffffffd60,
                         (size_type)in_stack_fffffffffffffd58);
              TemplatedValidityMask<unsigned_long>::SetInvalid
                        ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffffd60,
                         (idx_t)in_stack_fffffffffffffd58);
            }
            else {
              memset(&local_78,0,0x10);
              ppvVar6 = vector<void_*,_false>::operator[]
                                  ((vector<void_*,_false> *)in_stack_fffffffffffffd60,
                                   (size_type)in_stack_fffffffffffffd58);
              puVar7 = (undefined8 *)((long)*ppvVar6 + *(long *)(in_RDI + 0xf0) * 0x10);
              *puVar7 = local_78;
              puVar7[1] = local_70;
            }
            *(long *)(in_RDI + 0xf8) = *(long *)(in_RDI + 0xf8) + 1;
            *(long *)(in_RDI + 0x1d0) = *(long *)(in_RDI + 0x1d0) + 1;
          }
          else {
            *(long *)(in_RDI + 0xf8) = *(long *)(in_RDI + 0xf8) + 1;
          }
        }
      }
    }
    __src = (void *)(in_RDI + 0x118);
    pmVar9 = ::std::
             unordered_map<unsigned_long,_duckdb::FullLinePosition,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>_>
             ::operator[]((unordered_map<unsigned_long,_duckdb::FullLinePosition,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>_>
                           *)in_stack_fffffffffffffd60,(key_type *)in_stack_fffffffffffffd58);
    memcpy(pmVar9,__src,0x30);
    *(undefined8 *)(in_RDI + 0xf8) = 0;
    *(undefined8 *)(in_RDI + 0x1d0) = 0;
    *(long *)(in_RDI + 0xf0) = *(long *)(in_RDI + 0xf0) + 1;
    if (*(ulong *)(in_RDI + 0xf0) < *(ulong *)(in_RDI + 0x28)) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool StringValueResult::AddRowInternal() {
	LinePosition current_line_start = {iterator.pos.buffer_idx, iterator.pos.buffer_pos, buffer_size};
	idx_t current_line_size = current_line_start - current_line_position.end;
	if (store_line_size) {
		error_handler.NewMaxLineSize(current_line_size);
	}
	current_line_position.begin = current_line_position.end;
	current_line_position.end = current_line_start;
	if (current_line_size > state_machine.options.maximum_line_size.GetValue()) {
		current_errors.Insert(MAXIMUM_LINE_SIZE, 1, chunk_col_id, last_position, current_line_size);
	}
	if (!state_machine.options.null_padding) {
		for (idx_t col_idx = cur_col_id; col_idx < number_of_columns; col_idx++) {
			current_errors.Insert(TOO_FEW_COLUMNS, col_idx - 1, chunk_col_id, last_position);
		}
	}

	if (current_errors.HandleErrors(*this)) {
		D_ASSERT(buffer_handles.find(current_line_position.begin.buffer_idx) != buffer_handles.end());
		D_ASSERT(buffer_handles.find(current_line_position.end.buffer_idx) != buffer_handles.end());
		line_positions_per_row[static_cast<idx_t>(number_of_rows)] = current_line_position;
		number_of_rows++;
		if (static_cast<idx_t>(number_of_rows) >= result_size) {
			// We have a full chunk
			return true;
		}
		return false;
	}
	NullPaddingQuotedNewlineCheck();
	quoted_new_line = false;
	// We need to check if we are getting the correct number of columns here.
	// If columns are correct, we add it, and that's it.
	if (cur_col_id < number_of_columns) {
		// We have too few columns:
		if (null_padding) {
			while (cur_col_id < number_of_columns) {
				bool empty = false;
				if (cur_col_id < state_machine.options.force_not_null.size()) {
					empty = state_machine.options.force_not_null[cur_col_id];
				}
				if (projecting_columns) {
					if (!projected_columns[cur_col_id]) {
						cur_col_id++;
						continue;
					}
				}
				if (empty) {
					static_cast<string_t *>(vector_ptr[chunk_col_id])[number_of_rows] = string_t();
				} else {
					validity_mask[chunk_col_id]->SetInvalid(static_cast<idx_t>(number_of_rows));
				}
				cur_col_id++;
				chunk_col_id++;
			}
		} else {
			// If we are not null-padding this is an error
			if (!state_machine.options.IgnoreErrors()) {
				bool first_nl = false;
				auto borked_line =
				    current_line_position.ReconstructCurrentLine(first_nl, buffer_handles, PrintErrorLine());
				LinesPerBoundary lines_per_batch(iterator.GetBoundaryIdx(), lines_read);
				if (current_line_position.begin == last_position) {
					auto csv_error = CSVError::IncorrectColumnAmountError(
					    state_machine.options, cur_col_id - 1, lines_per_batch, borked_line,
					    current_line_position.begin.GetGlobalPosition(requested_size, first_nl),
					    last_position.GetGlobalPosition(requested_size, first_nl), path);
					error_handler.Error(csv_error);
				} else {
					auto csv_error = CSVError::IncorrectColumnAmountError(
					    state_machine.options, cur_col_id - 1, lines_per_batch, borked_line,
					    current_line_position.begin.GetGlobalPosition(requested_size, first_nl),
					    last_position.GetGlobalPosition(requested_size), path);
					error_handler.Error(csv_error);
				}
			}
			// If we are here we ignore_errors, so we delete this line
			RemoveLastLine();
		}
	}
	D_ASSERT(buffer_handles.find(current_line_position.begin.buffer_idx) != buffer_handles.end());
	D_ASSERT(buffer_handles.find(current_line_position.end.buffer_idx) != buffer_handles.end());
	line_positions_per_row[static_cast<idx_t>(number_of_rows)] = current_line_position;
	cur_col_id = 0;
	chunk_col_id = 0;
	number_of_rows++;
	if (static_cast<idx_t>(number_of_rows) >= result_size) {
		// We have a full chunk
		return true;
	}
	return false;
}